

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

void __thiscall wasm::Literal::Literal(Literal *this,shared_ptr<wasm::GCData> *gcData,HeapType type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  
  (this->field_0).i64 =
       (int64_t)(gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->type).id =
       (uint)((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
             (element_type *)0x0) * 2 | type.id;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    bVar4 = wasm::Type::isData(&this->type);
    if (((((!bVar4) ||
          ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
           (element_type *)0x0)) &&
         ((uVar5 = (uint)type.id & 0x7b, uVar5 != 8 || 0x7c < type.id ||
          ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
           (element_type *)0x0)))) &&
        (((0x7c < type.id || (4 < (uVar5 << 0x1d | uVar5 - 8 >> 3) - 10)) ||
         ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0)))) &&
       (((0x7c < type.id || (uVar5 != 0x20)) ||
        ((peVar2 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
         peVar2 == (element_type *)0x0 ||
         ((uVar3 = (peVar2->type).id, 0x7c < uVar3 || (((uint)uVar3 & 0x7b) != 0x50)))))))) {
      __assert_fail("(isData() && gcData) || (type.isMaybeShared(HeapType::ext) && gcData) || (type.isBottom() && !gcData) || (type.isMaybeShared(HeapType::any) && gcData && gcData->type.isMaybeShared(HeapType::string))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x54,"wasm::Literal::Literal(std::shared_ptr<GCData>, HeapType)");
    }
    return;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

Literal::Literal(std::shared_ptr<GCData> gcData, HeapType type)
  : gcData(gcData), type(type, gcData ? NonNullable : Nullable) {
  // TODO: Use exact types for gcData.
  // The type must be a proper type for GC data: either a struct, array, or
  // string; or an externalized version of the same; or a null; or an
  // internalized string (which appears as an anyref).
  assert((isData() && gcData) ||
         (type.isMaybeShared(HeapType::ext) && gcData) ||
         (type.isBottom() && !gcData) ||
         (type.isMaybeShared(HeapType::any) && gcData &&
          gcData->type.isMaybeShared(HeapType::string)));
}